

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O3

ssize_t __thiscall pbrt::BinaryWriter::write(BinaryWriter *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  undefined1 local_14 [4];
  
  writeRaw(this,local_14,4);
  writeRaw(this,*(void **)CONCAT44(in_register_00000034,__fd),
           ((undefined8 *)CONCAT44(in_register_00000034,__fd))[1]);
  return extraout_RAX;
}

Assistant:

void write(const std::string &t)
    {
      write((int32_t)t.size());
      writeRaw(&t[0],t.size());
    }